

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catridge.cpp
# Opt level: O2

void __thiscall Catridge::Catridge(Catridge *this,string *sFileName)

{
  char cVar1;
  size_type __new_size;
  sHeader header;
  __shared_ptr<Mapper_000,_(__gnu_cxx::_Lock_policy)2> local_238;
  ifstream ifs;
  
  this->mirror = HORIZONTAL;
  this->bImageValid = false;
  (this->vPRGMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vPRGMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vPRGMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vCHRMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vCHRMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vCHRMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   ((long)&(this->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
   + 7) = 0;
  std::ifstream::ifstream(&ifs,(string *)sFileName,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::istream::read((char *)&ifs,(long)&header);
    if ((header.mapper1 & 4) != 0) {
      std::istream::seekg((long)&ifs,0x200);
    }
    this->nMapperID = header.mapper1 >> 4 | header.mapper2 & 0xf0;
    this->mirror = (uint)(header.mapper1 & 1);
    this->nPRGBanks = header.prg_rom_chunks;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->vPRGMemory,(ulong)header.prg_rom_chunks << 0xe);
    std::istream::read((char *)&ifs,
                       (long)(this->vPRGMemory).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    this->nCHRBanks = header.chr_rom_chunks;
    __new_size = 0x2000;
    if (header.chr_rom_chunks != '\0') {
      __new_size = (ulong)header.chr_rom_chunks << 0xd;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->vCHRMemory,__new_size)
    ;
    std::istream::read((char *)&ifs,
                       (long)(this->vCHRMemory).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (this->nMapperID == '\0') {
      std::make_shared<Mapper_000,unsigned_char&,unsigned_char&>
                ((uchar *)&local_238,&this->nPRGBanks);
      std::__shared_ptr<Mapper,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Mapper,(__gnu_cxx::_Lock_policy)2> *)&this->pMapper,&local_238);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_238._M_refcount);
    }
    this->bImageValid = true;
  }
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

Catridge::Catridge(const string &sFileName)
{
  struct sHeader
  {
    char name[4];
    uint8_t prg_rom_chunks;
    uint8_t chr_rom_chunks;
    uint8_t mapper1;
    uint8_t mapper2;
    uint8_t prg_ram_size;
    uint8_t tv_system1;
    uint8_t tv_system2;
    char unused[5];
  } header;

  std::ifstream ifs(sFileName, ifstream::binary);
  if (ifs.is_open())
  {
    ifs.read((char *)&header, sizeof(sHeader));

    if (header.mapper1 & 0x04u)
    {
      ifs.seekg(512, ios_base::cur);
    }

    nMapperID = ((header.mapper2 >> 4) << 4) | (header.mapper1 >> 4);
    mirror = (header.mapper1 & 0x01u) ? VERTICAL : HORIZONTAL;

    // "Discover" File format
    uint8_t nFileType = 1;

    if (nFileType == 0)
    {
    }

    if (nFileType == 1)
    {
      nPRGBanks = header.prg_rom_chunks;
      vPRGMemory.resize(nPRGBanks * 16384); // nPRGBanks * 16 KB
      ifs.read((char *)vPRGMemory.data(), vPRGMemory.size());

      nCHRBanks = header.chr_rom_chunks;
      if (nCHRBanks == 0)
      {
        vCHRMemory.resize(8192); // 8 KB
      }
      else
      {
        vCHRMemory.resize(nCHRBanks * 8192); // nPRGBanks * 8 KB
      }
      ifs.read((char *)vCHRMemory.data(), vCHRMemory.size());
    }

    if (nFileType == 2)
    {
    }

    switch (nMapperID)
    {
    case 0:
      pMapper = make_shared<Mapper_000>(nPRGBanks, nCHRBanks);
      break;
    default:
      break;
    }

    bImageValid = true;
  }
}